

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

CPrivKey * __thiscall CKey::GetPrivKey(CPrivKey *__return_storage_ptr__,CKey *this)

{
  int iVar1;
  long in_FS_OFFSET;
  size_t seckeylen;
  size_t local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->keydata)._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
      (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("keydata",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0xaa,"CPrivKey CKey::GetPrivKey() const");
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize(__return_storage_ptr__,0x117)
  ;
  local_20 = 0x117;
  iVar1 = ec_seckey_export_der
                    (secp256k1_context_sign,
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start,&local_20,
                     ((this->keydata)._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
                     ->_M_elems,this->fCompressed);
  if (iVar1 != 0) {
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize
              (__return_storage_ptr__,local_20);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
    __stack_chk_fail();
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp",
                0xb1,"CPrivKey CKey::GetPrivKey() const");
}

Assistant:

CPrivKey CKey::GetPrivKey() const {
    assert(keydata);
    CPrivKey seckey;
    int ret;
    size_t seckeylen;
    seckey.resize(SIZE);
    seckeylen = SIZE;
    ret = ec_seckey_export_der(secp256k1_context_sign, seckey.data(), &seckeylen, UCharCast(begin()), fCompressed);
    assert(ret);
    seckey.resize(seckeylen);
    return seckey;
}